

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1531.c
# Opt level: O3

int test(char *URL)

{
  int iVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  long lVar4;
  ulong uVar5;
  int *piVar6;
  fd_set *__exceptfds;
  undefined8 uVar7;
  fd_set *__writefds;
  fd_set *__readfds;
  timeval *__timeout;
  timeval tVar8;
  int maxfd;
  int still_running;
  long curl_timeo;
  timeval timeout;
  timeval wait;
  int msgs_left;
  fd_set fdexcep;
  fd_set fdwrite;
  int local_1f0;
  int local_1ec;
  undefined8 local_1e8;
  ulong local_1e0;
  timeval local_1d8;
  timeval local_1c8;
  fd_set local_1b8;
  fd_set local_138;
  fd_set local_b8;
  
  tv_test_start = tutil_tvnow();
  iVar1 = curl_global_init(3);
  uVar3 = _stderr;
  if (iVar1 == 0) {
    uVar3 = curl_easy_init();
    uVar2 = curl_multi_init();
    curl_multi_add_handle(uVar2,uVar3);
    curl_easy_setopt(uVar3,0x2712,URL);
    curl_easy_setopt(uVar3,0x75a8,8);
    curl_easy_setopt(uVar3,0x271f,".abc");
    curl_multi_perform(uVar2,&local_1ec);
    tVar8 = tutil_tvnow();
    lVar4 = tutil_tvdiff(tVar8,tv_test_start);
    if (lVar4 < 0xea61) {
      local_1e8 = uVar3;
      do {
        local_1f0 = -1;
        local_1e0 = 0xffffffffffffffff;
        local_1b8.fds_bits[0] = 0;
        local_1b8.fds_bits[1] = 0;
        local_1b8.fds_bits[2] = 0;
        local_1b8.fds_bits[3] = 0;
        local_1b8.fds_bits[4] = 0;
        local_1b8.fds_bits[5] = 0;
        local_1b8.fds_bits[6] = 0;
        local_1b8.fds_bits[7] = 0;
        local_1b8.fds_bits[8] = 0;
        local_1b8.fds_bits[9] = 0;
        local_1b8.fds_bits[10] = 0;
        local_1b8.fds_bits[0xb] = 0;
        local_1b8.fds_bits[0xc] = 0;
        local_1b8.fds_bits[0xd] = 0;
        local_1b8.fds_bits[0xe] = 0;
        local_1b8.fds_bits[0xf] = 0;
        local_b8.fds_bits[0] = 0;
        local_b8.fds_bits[1] = 0;
        local_b8.fds_bits[2] = 0;
        local_b8.fds_bits[3] = 0;
        local_b8.fds_bits[4] = 0;
        local_b8.fds_bits[5] = 0;
        local_b8.fds_bits[6] = 0;
        local_b8.fds_bits[7] = 0;
        local_b8.fds_bits[8] = 0;
        local_b8.fds_bits[9] = 0;
        local_b8.fds_bits[10] = 0;
        local_b8.fds_bits[0xb] = 0;
        local_b8.fds_bits[0xc] = 0;
        local_b8.fds_bits[0xd] = 0;
        local_b8.fds_bits[0xe] = 0;
        local_b8.fds_bits[0xf] = 0;
        local_138.fds_bits[0xe] = 0;
        local_138.fds_bits[0xf] = 0;
        local_138.fds_bits[0xc] = 0;
        local_138.fds_bits[0xd] = 0;
        local_138.fds_bits[10] = 0;
        local_138.fds_bits[0xb] = 0;
        local_138.fds_bits[8] = 0;
        local_138.fds_bits[9] = 0;
        local_138.fds_bits[6] = 0;
        local_138.fds_bits[7] = 0;
        local_138.fds_bits[4] = 0;
        local_138.fds_bits[5] = 0;
        local_138.fds_bits[2] = 0;
        local_138.fds_bits[3] = 0;
        local_138.fds_bits[0] = 0;
        local_138.fds_bits[1] = 0;
        local_1d8.tv_sec = 1;
        local_1d8.tv_usec = 0;
        curl_multi_timeout(uVar2,&local_1e0);
        if (-1 < (long)local_1e0) {
          local_1d8.tv_sec = local_1e0 / 1000;
          if (local_1e0 < 2000) {
            uVar5 = local_1e0 - 1000;
            if (local_1e0 < 1000) {
              uVar5 = local_1e0;
            }
            local_1d8.tv_usec = uVar5 * 1000;
          }
          else {
            local_1d8.tv_sec = 1;
          }
        }
        iVar1 = curl_multi_fdset(uVar2,&local_1b8,&local_b8,&local_138,&local_1f0);
        if (iVar1 != 0) {
          curl_mfprintf(_stderr,"curl_multi_fdset() failed, code %d.\n",iVar1);
          break;
        }
        if (local_1f0 == -1) {
          local_1c8.tv_sec = 0;
          local_1c8.tv_usec = 100000;
          iVar1 = 0;
          __readfds = (fd_set *)0x0;
          __writefds = (fd_set *)0x0;
          __exceptfds = (fd_set *)0x0;
          __timeout = &local_1c8;
        }
        else {
          iVar1 = local_1f0 + 1;
          __timeout = &local_1d8;
          __exceptfds = &local_138;
          __writefds = &local_b8;
          __readfds = &local_1b8;
        }
        iVar1 = select(iVar1,__readfds,__writefds,__exceptfds,__timeout);
        if (iVar1 != -1) {
          curl_multi_perform(uVar2,&local_1ec);
        }
        tVar8 = tutil_tvnow();
        lVar4 = tutil_tvdiff(tVar8,tv_test_start);
        if (60000 < lVar4) {
          curl_mfprintf(_stderr,
                        "%s:%d ABORTING TEST, since it seems that it would have run forever.\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib1531.c"
                        ,0x87);
          iVar1 = 0x7d;
          uVar3 = local_1e8;
          goto LAB_00102659;
        }
      } while (local_1ec != 0);
      uVar3 = local_1e8;
      do {
        piVar6 = (int *)curl_multi_info_read(uVar2,&local_1b8);
        if ((piVar6 != (int *)0x0) && (*piVar6 == 1)) {
          iVar1 = 0;
          curl_mprintf("HTTP transfer completed with status %d\n",piVar6[4]);
          goto LAB_00102659;
        }
        tVar8 = tutil_tvnow();
        lVar4 = tutil_tvdiff(tVar8,tv_test_start);
        if (60000 < lVar4) {
          uVar7 = 0x92;
          goto LAB_0010264d;
        }
      } while (piVar6 != (int *)0x0);
      iVar1 = 0;
    }
    else {
      uVar7 = 0x40;
LAB_0010264d:
      curl_mfprintf(_stderr,"%s:%d ABORTING TEST, since it seems that it would have run forever.\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib1531.c"
                    ,uVar7);
      iVar1 = 0x7d;
    }
LAB_00102659:
    curl_multi_cleanup(uVar2);
    curl_easy_cleanup(uVar3);
    curl_global_cleanup();
  }
  else {
    uVar2 = curl_easy_strerror(iVar1);
    curl_mfprintf(uVar3,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib1531.c"
                  ,0x2c,iVar1,uVar2);
  }
  return iVar1;
}

Assistant:

int test(char *URL)
{
  CURL *easy;
  CURLM *multi_handle;
  int still_running; /* keep number of running handles */
  CURLMsg *msg; /* for picking up messages with the transfer status */
  int msgs_left; /* how many messages are left */
  int res = CURLE_OK;

  start_test_timing();

  global_init(CURL_GLOBAL_ALL);

  /* Allocate one CURL handle per transfer */
  easy = curl_easy_init();

  /* init a multi stack */
  multi_handle = curl_multi_init();

  /* add the individual transfer */
  curl_multi_add_handle(multi_handle, easy);

  /* set the options (I left out a few, you'll get the point anyway) */
  curl_easy_setopt(easy, CURLOPT_URL, URL);
  curl_easy_setopt(easy, CURLOPT_POSTFIELDSIZE_LARGE,
                   (curl_off_t)testDataSize);
  curl_easy_setopt(easy, CURLOPT_POSTFIELDS, testData);

  /* we start some action by calling perform right away */
  curl_multi_perform(multi_handle, &still_running);

  abort_on_test_timeout();

  do {
    struct timeval timeout;
    int rc; /* select() return code */
    CURLMcode mc; /* curl_multi_fdset() return code */

    fd_set fdread;
    fd_set fdwrite;
    fd_set fdexcep;
    int maxfd = -1;

    long curl_timeo = -1;

    FD_ZERO(&fdread);
    FD_ZERO(&fdwrite);
    FD_ZERO(&fdexcep);

    /* set a suitable timeout to play around with */
    timeout.tv_sec = 1;
    timeout.tv_usec = 0;

    curl_multi_timeout(multi_handle, &curl_timeo);
    if(curl_timeo >= 0) {
      timeout.tv_sec = curl_timeo / 1000;
      if(timeout.tv_sec > 1)
        timeout.tv_sec = 1;
      else
        timeout.tv_usec = (curl_timeo % 1000) * 1000;
    }

    /* get file descriptors from the transfers */
    mc = curl_multi_fdset(multi_handle, &fdread, &fdwrite, &fdexcep, &maxfd);

    if(mc != CURLM_OK) {
      fprintf(stderr, "curl_multi_fdset() failed, code %d.\n", mc);
      break;
    }

    /* On success the value of maxfd is guaranteed to be >= -1. We call
       select(maxfd + 1, ...); specially in case of (maxfd == -1) there are
       no fds ready yet so we call select(0, ...) --or Sleep() on Windows--
       to sleep 100ms, which is the minimum suggested value in the
       curl_multi_fdset() doc. */

    if(maxfd == -1) {
#ifdef _WIN32
      Sleep(100);
      rc = 0;
#else
      /* Portable sleep for platforms other than Windows. */
      struct timeval wait = { 0, 100 * 1000 }; /* 100ms */
      rc = select(0, NULL, NULL, NULL, &wait);
#endif
    }
    else {
      /* Note that on some platforms 'timeout' may be modified by select().
         If you need access to the original value save a copy beforehand. */
      rc = select(maxfd + 1, &fdread, &fdwrite, &fdexcep, &timeout);
    }

    switch(rc) {
    case -1:
      /* select error */
      break;
    case 0: /* timeout */
    default: /* action */
      curl_multi_perform(multi_handle, &still_running);
      break;
    }

    abort_on_test_timeout();
  } while(still_running);

  /* See how the transfers went */
  do {
    msg = curl_multi_info_read(multi_handle, &msgs_left);
    if(msg && msg->msg == CURLMSG_DONE) {
      printf("HTTP transfer completed with status %d\n", msg->data.result);
      break;
    }

    abort_on_test_timeout();
  } while(msg);

test_cleanup:
  curl_multi_cleanup(multi_handle);

  /* Free the CURL handles */
  curl_easy_cleanup(easy);
  curl_global_cleanup();

  return res;
}